

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

mbedtls_cipher_info_t * mbedtls_cipher_info_from_type(mbedtls_cipher_type_t cipher_type)

{
  mbedtls_cipher_definition_t *local_20;
  mbedtls_cipher_definition_t *def;
  mbedtls_cipher_type_t cipher_type_local;
  
  local_20 = mbedtls_cipher_definitions;
  while( true ) {
    if (local_20->info == (mbedtls_cipher_info_t *)0x0) {
      return (mbedtls_cipher_info_t *)0x0;
    }
    if (local_20->type == cipher_type) break;
    local_20 = local_20 + 1;
  }
  return local_20->info;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_type( const mbedtls_cipher_type_t cipher_type )
{
    const mbedtls_cipher_definition_t *def;

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( def->type == cipher_type )
            return( def->info );

    return( NULL );
}